

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void * vrna_alloc(uint size)

{
  void *pvVar1;
  int *piVar2;
  
  pvVar1 = calloc(1,(ulong)size);
  if (pvVar1 == (void *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      vrna_message_error("Memory allocation failure -> no memory");
    }
    if (*piVar2 == 0x16) {
      vrna_alloc_cold_1();
    }
  }
  return pvVar1;
}

Assistant:

PUBLIC void *
vrna_alloc(unsigned size)
{
  void *pointer;

  if ((pointer = (void *)calloc(1, (size_t)size)) == NULL) {
#ifdef EINVAL
    if (errno == EINVAL) {
      fprintf(stderr, "vrna_alloc: requested size: %d\n", size);
      vrna_message_error("Memory allocation failure -> EINVAL");
    }

    if (errno == ENOMEM)
#endif
    vrna_message_error("Memory allocation failure -> no memory");
  }

  return pointer;
}